

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O0

void __thiscall
fasttext::ProductQuantizer::compute_code(ProductQuantizer *this,real *x,uint8_t *code)

{
  uint8_t *in_RDX;
  real *in_RSI;
  ProductQuantizer *in_RDI;
  ProductQuantizer *unaff_retaddr;
  int m;
  int32_t d;
  int local_20;
  int32_t d_00;
  ProductQuantizer *x_00;
  
  d_00 = in_RDI->dsub_;
  x_00 = in_RDI;
  for (local_20 = 0; local_20 < in_RDI->nsubq_; local_20 = local_20 + 1) {
    if (local_20 == in_RDI->nsubq_ + -1) {
      d_00 = in_RDI->lastdsub_;
    }
    get_centroids(in_RDI,(int32_t)((ulong)(in_RSI + local_20 * in_RDI->dsub_) >> 0x20),
                  (uint8_t)((ulong)(in_RSI + local_20 * in_RDI->dsub_) >> 0x18));
    assign_centroid(unaff_retaddr,(real *)x_00,in_RSI,in_RDX,d_00);
  }
  return;
}

Assistant:

void ProductQuantizer::compute_code(const real* x, uint8_t* code) const {
  auto d = dsub_;
  for (auto m = 0; m < nsubq_; m++) {
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    assign_centroid(x + m * dsub_, get_centroids(m, 0), code + m, d);
  }
}